

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void helper_cache_mips64el(CPUMIPSState_conflict5 *env,target_ulong addr,uint32_t op)

{
  ulong addr_00;
  
  addr_00 = (ulong)((uint)addr & 0x1fffffff);
  if (op == 5) {
    memory_region_dispatch_read_mips64el
              ((uc_struct_conflict7 *)env->uc,env->itc_tag,addr_00,&env->CP0_TagLo,MO_64,
               (MemTxAttrs)0x1);
    return;
  }
  if (op == 9) {
    memory_region_dispatch_write_mips64el
              ((uc_struct_conflict7 *)env->uc,env->itc_tag,addr_00,env->CP0_TagLo,MO_64,
               (MemTxAttrs)0x1);
    return;
  }
  return;
}

Assistant:

void helper_cache(CPUMIPSState *env, target_ulong addr, uint32_t op)
{
    target_ulong index = addr & 0x1fffffff;
    if (op == 9) {
        /* Index Store Tag */
        memory_region_dispatch_write(env->uc, env->itc_tag, index, env->CP0_TagLo,
                                     MO_64, MEMTXATTRS_UNSPECIFIED);
    } else if (op == 5) {
        /* Index Load Tag */
        memory_region_dispatch_read(env->uc, env->itc_tag, index, &env->CP0_TagLo,
                                    MO_64, MEMTXATTRS_UNSPECIFIED);
    }
}